

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::CEscape_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view src)

{
  Nonnull<std::string_*> dest_00;
  string_view src_00;
  string_view src_local;
  string *dest;
  
  dest_00 = (Nonnull<std::string_*>)src._M_str;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  src_00._M_str = (char *)__return_storage_ptr__;
  src_00._M_len = src._M_len;
  anon_unknown_0::CEscapeAndAppendInternal((anon_unknown_0 *)this,src_00,dest_00);
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(absl::string_view src) {
  std::string dest;
  CEscapeAndAppendInternal(src, &dest);
  return dest;
}